

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

index_t GEO::BalancedKdTree::max_node_index(index_t node_id,index_t b,index_t e)

{
  index_t iVar1;
  uint uVar2;
  index_t e_00;
  
  uVar2 = 0;
  while (0x10 < e - b) {
    e_00 = (e - b >> 1) + b;
    iVar1 = max_node_index(node_id * 2,b,e_00);
    node_id = node_id * 2 + 1;
    b = e_00;
    if (uVar2 < iVar1) {
      uVar2 = iVar1;
    }
  }
  if (uVar2 < node_id) {
    uVar2 = node_id;
  }
  return uVar2;
}

Assistant:

static index_t max_node_index(
            index_t node_id, index_t b, index_t e
        ) {
            if(e - b <= MAX_LEAF_SIZE) {
                return node_id;
            }
            index_t m = b + (e - b) / 2;
            return std::max(
                max_node_index(2 * node_id, b, m),
                max_node_index(2 * node_id + 1, m, e)
            );
        }